

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_read_next_extension(nifti1_extension *nex,nifti_image *nim,int remain,znzFile fp)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  void *pvVar5;
  uint local_40;
  uint local_3c;
  int code;
  int size;
  int count;
  int swap;
  znzFile fp_local;
  nifti_image *pnStack_20;
  int remain_local;
  nifti_image *nim_local;
  nifti1_extension *nex_local;
  
  iVar2 = nim->byteorder;
  _count = fp;
  fp_local._4_4_ = remain;
  pnStack_20 = nim;
  nim_local = (nifti_image *)nex;
  iVar1 = nifti_short_order();
  size = (int)(iVar2 != iVar1);
  nim_local->nx = 0;
  nim_local->ndim = 0;
  nim_local->ny = 0;
  nim_local->nz = 0;
  if ((int)fp_local._4_4_ < 0x10) {
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d only %d bytes remain, so no extension\n",(ulong)fp_local._4_4_);
    }
    nex_local._4_4_ = 0;
  }
  else {
    sVar3 = znzread(&local_3c,4,1,_count);
    code = (int)sVar3;
    if (code == 1) {
      sVar3 = znzread(&local_40,4,1,_count);
      code = (int)sVar3 + code;
    }
    if (code == 2) {
      if (size != 0) {
        if (2 < g_opts.debug) {
          fprintf(_stderr,"-d pre-swap exts: code %d, size %d\n",(ulong)local_40,(ulong)local_3c);
        }
        nifti_swap_4bytes(1,&local_3c);
        nifti_swap_4bytes(1,&local_40);
      }
      if (2 < g_opts.debug) {
        fprintf(_stderr,"-d potential extension: code %d, size %d\n",(ulong)local_40,(ulong)local_3c
               );
      }
      iVar2 = nifti_check_extension(pnStack_20,local_3c,local_40,fp_local._4_4_);
      if (iVar2 == 0) {
        lVar4 = znzseek(_count,-8,1);
        if (lVar4 < 0) {
          fprintf(_stderr,"** failure to back out of extension read!\n");
          nex_local._4_4_ = -1;
        }
        else {
          nex_local._4_4_ = 0;
        }
      }
      else {
        nim_local->ndim = local_3c;
        nim_local->nx = local_40;
        local_3c = local_3c - 8;
        pvVar5 = malloc((long)(int)local_3c);
        *(void **)&nim_local->ny = pvVar5;
        lVar4._0_4_ = nim_local->ny;
        lVar4._4_4_ = nim_local->nz;
        if (lVar4 == 0) {
          fprintf(_stderr,"** failed to allocate %d bytes for extension\n",(ulong)local_3c);
          nex_local._4_4_ = -1;
        }
        else {
          sVar3 = znzread(*(void **)&nim_local->ny,1,(long)(int)local_3c,_count);
          code = (int)sVar3;
          if (code < (int)local_3c) {
            if (0 < g_opts.debug) {
              fprintf(_stderr,"-d read only %d (of %d) bytes for extension\n",sVar3 & 0xffffffff,
                      (ulong)local_3c);
            }
            free(*(void **)&nim_local->ny);
            nim_local->ny = 0;
            nim_local->nz = 0;
            nex_local._4_4_ = -1;
          }
          else {
            if (2 < g_opts.debug) {
              fprintf(_stderr,"+d successfully read extension, code %d, size %d\n",
                      (ulong)(uint)nim_local->nx,(ulong)(uint)nim_local->ndim);
            }
            nex_local._4_4_ = nim_local->ndim;
          }
        }
      }
    }
    else {
      if (2 < g_opts.debug) {
        fprintf(_stderr,"-d current extension read failed\n");
      }
      znzseek(_count,(long)(code * -4),1);
      nex_local._4_4_ = 0;
    }
  }
  return nex_local._4_4_;
}

Assistant:

static int nifti_read_next_extension( nifti1_extension * nex, nifti_image *nim,
                                      int remain, znzFile fp )
{
   int swap = nim->byteorder != nifti_short_order();
   int count, size, code;

   /* first clear nex */
   nex->esize = nex->ecode = 0;
   nex->edata = NULL;

   if( remain < 16 ){
      if( g_opts.debug > 2 )
         fprintf(stderr,"-d only %d bytes remain, so no extension\n", remain);
      return 0;
   }

   /* must start with 4-byte size and code */
   count = (int)znzread( &size, 4, 1, fp );
   if( count == 1 ) count += (int)znzread( &code, 4, 1, fp );

   if( count != 2 ){
      if( g_opts.debug > 2 )
         fprintf(stderr,"-d current extension read failed\n");
      znzseek(fp, -4*count, SEEK_CUR); /* back up past any read */
      return 0;                        /* no extension, no error condition */
   }

   if( swap ){
      if( g_opts.debug > 2 )
         fprintf(stderr,"-d pre-swap exts: code %d, size %d\n", code, size);

      nifti_swap_4bytes(1, &size);
      nifti_swap_4bytes(1, &code);
   }

   if( g_opts.debug > 2 )
      fprintf(stderr,"-d potential extension: code %d, size %d\n", code, size);

   if( !nifti_check_extension(nim, size, code, remain) ){
      if( znzseek(fp, -8, SEEK_CUR) < 0 ){      /* back up past any read */
         fprintf(stderr,"** failure to back out of extension read!\n");
         return -1;
      }
      return 0;
   }

   /* now get the actual data */
   nex->esize = size;
   nex->ecode = code;

   size -= 8;  /* subtract space for size and code in extension */
   nex->edata = (char *)malloc(size * sizeof(char));
   if( !nex->edata ){
      fprintf(stderr,"** failed to allocate %d bytes for extension\n",size);
      return -1;
   }

   count = (int)znzread(nex->edata, 1, size, fp);
   if( count < size ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"-d read only %d (of %d) bytes for extension\n",
                 count, size);
      free(nex->edata);
      nex->edata = NULL;
      return -1;
   }

   /* success! */
   if( g_opts.debug > 2 )
      fprintf(stderr,"+d successfully read extension, code %d, size %d\n",
              nex->ecode, nex->esize);

   return nex->esize;
}